

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<std::function<void_()>,_0UL>::clear
          (SmallVector<std::function<void_()>,_0UL> *this)

{
  function<void_()> *pfVar1;
  code *pcVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  uVar3 = (this->super_VectorView<std::function<void_()>_>).buffer_size;
  if (uVar3 != 0) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      pfVar1 = (this->super_VectorView<std::function<void_()>_>).ptr;
      pcVar2 = *(code **)((long)&(pfVar1->super__Function_base)._M_manager + lVar5);
      if (pcVar2 != (code *)0x0) {
        lVar4 = (long)&(pfVar1->super__Function_base)._M_functor + lVar5;
        (*pcVar2)(lVar4,lVar4,3);
        uVar3 = (this->super_VectorView<std::function<void_()>_>).buffer_size;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x20;
    } while (uVar6 < uVar3);
  }
  (this->super_VectorView<std::function<void_()>_>).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}